

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void __thiscall
HistoryBuffer::ReadBuffer
          (HistoryBuffer *this,float *buffer,int numsamplesTarget,int numsamplesSource,float offset)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar1 = numsamplesTarget - 1;
  iVar3 = this->writeindex;
  iVar10 = numsamplesTarget + -2;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  pfVar4 = this->data;
  iVar9 = -1;
  uVar8 = uVar7;
  do {
    bVar11 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar11) {
      iVar9 = (int)uVar7;
      break;
    }
    fVar13 = (float)iVar3 - offset;
    iVar6 = this->length;
    fVar14 = (float)iVar6;
    fVar13 = (float)(-(uint)(fVar13 < 0.0) & (uint)(fVar13 + fVar14) |
                    ~-(uint)(fVar13 < 0.0) & (uint)fVar13);
    fVar12 = floorf(fVar13);
    iVar5 = (int)fVar12;
    if (iVar5 != 0) {
      iVar6 = iVar5;
    }
    fVar2 = pfVar4[(long)iVar6 + -1];
    buffer[iVar10] = (fVar13 - (float)(int)fVar12) * (pfVar4[iVar5] - fVar2) + fVar2;
    offset = offset + (float)numsamplesSource / (float)(int)uVar1;
    iVar10 = iVar10 + -1;
    iVar9 = iVar9 + 1;
  } while (offset < fVar14);
  buffer[(int)uVar1] = (float)iVar9;
  return;
}

Assistant:

void HistoryBuffer::ReadBuffer(float* buffer, int numsamplesTarget, int numsamplesSource, float offset)
{
    numsamplesTarget--; // reserve last sample for count of how much we were able to read
    float speed = (float)numsamplesSource / (float)numsamplesTarget;
    int n, w = writeindex; // since ReadBuffer is called from the GUI thread, writeindex may be modified by the DSP thread simultaneously
    float p = offset;
    for (n = 0; n < numsamplesTarget; n++)
    {
        float f = w - p;
        if (f < 0.0f)
            f += length;
        int i = FastFloor(f);
        float s1 = data[(i == 0) ? (length - 1) : (i - 1)];
        float s2 = data[i];
        buffer[numsamplesTarget - 1 - n] = s1 + (s2 - s1) * (f - i);
        p += speed;
        if (p >= length)
            break;
    }
    buffer[numsamplesTarget] = (float)n; // how many samples were written
}